

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::setTransitionMatrix
          (BeagleCPUImpl<float,_1,_0> *this,int matrixIndex,double *inMatrix,double paddedValue)

{
  double *pdVar1;
  float *pfVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  ulong uVar14;
  float *pfVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  
  iVar3 = this->kCategoryCount;
  if (0 < iVar3) {
    pfVar15 = this->gTransitionMatrices[matrixIndex];
    iVar4 = this->kStateCount;
    iVar5 = this->kTransPaddedStateCount;
    auVar20 = vpbroadcastq_avx512f();
    iVar17 = 0;
    auVar21 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      if (0 < iVar4) {
        iVar18 = 0;
        do {
          uVar16 = 0;
          do {
            auVar22 = vpbroadcastq_avx512f();
            auVar22 = vporq_avx512f(auVar22,auVar21);
            uVar14 = vpcmpuq_avx512f(auVar22,auVar20,2);
            pdVar1 = inMatrix + uVar16;
            auVar22._8_8_ = (ulong)((byte)(uVar14 >> 1) & 1) * (long)pdVar1[1];
            auVar22._0_8_ = (ulong)((byte)uVar14 & 1) * (long)*pdVar1;
            auVar22._16_8_ = (ulong)((byte)(uVar14 >> 2) & 1) * (long)pdVar1[2];
            auVar22._24_8_ = (ulong)((byte)(uVar14 >> 3) & 1) * (long)pdVar1[3];
            auVar22._32_8_ = (ulong)((byte)(uVar14 >> 4) & 1) * (long)pdVar1[4];
            auVar22._40_8_ = (ulong)((byte)(uVar14 >> 5) & 1) * (long)pdVar1[5];
            auVar22._48_8_ = (ulong)((byte)(uVar14 >> 6) & 1) * (long)pdVar1[6];
            auVar22._56_8_ = (uVar14 >> 7) * (long)pdVar1[7];
            auVar19 = vcvtpd2ps_avx512f(auVar22);
            pfVar2 = pfVar15 + uVar16;
            bVar6 = (bool)((byte)uVar14 & 1);
            bVar7 = (bool)((byte)(uVar14 >> 1) & 1);
            bVar8 = (bool)((byte)(uVar14 >> 2) & 1);
            bVar9 = (bool)((byte)(uVar14 >> 3) & 1);
            bVar10 = (bool)((byte)(uVar14 >> 4) & 1);
            bVar11 = (bool)((byte)(uVar14 >> 5) & 1);
            bVar12 = (bool)((byte)(uVar14 >> 6) & 1);
            bVar13 = SUB81(uVar14 >> 7,0);
            *pfVar2 = (float)((uint)bVar6 * auVar19._0_4_ | (uint)!bVar6 * (int)*pfVar2);
            pfVar2[1] = (float)((uint)bVar7 * auVar19._4_4_ | (uint)!bVar7 * (int)pfVar2[1]);
            pfVar2[2] = (float)((uint)bVar8 * auVar19._8_4_ | (uint)!bVar8 * (int)pfVar2[2]);
            pfVar2[3] = (float)((uint)bVar9 * auVar19._12_4_ | (uint)!bVar9 * (int)pfVar2[3]);
            pfVar2[4] = (float)((uint)bVar10 * auVar19._16_4_ | (uint)!bVar10 * (int)pfVar2[4]);
            pfVar2[5] = (float)((uint)bVar11 * auVar19._20_4_ | (uint)!bVar11 * (int)pfVar2[5]);
            pfVar2[6] = (float)((uint)bVar12 * auVar19._24_4_ | (uint)!bVar12 * (int)pfVar2[6]);
            pfVar2[7] = (float)((uint)bVar13 * auVar19._28_4_ | (uint)!bVar13 * (int)pfVar2[7]);
            uVar16 = uVar16 + 8;
          } while ((iVar4 + 7U & 0xfffffff8) != uVar16);
          pfVar15[iVar4] = (float)paddedValue;
          pfVar15 = pfVar15 + iVar5;
          inMatrix = inMatrix + iVar4;
          iVar18 = iVar18 + 1;
        } while (iVar18 != iVar4);
      }
      iVar17 = iVar17 + 1;
    } while (iVar17 != iVar3);
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::setTransitionMatrix(int matrixIndex,
                                       const double* inMatrix,
                                       double paddedValue) {

if (T_PAD != 0) {
    const double* offsetInMatrix = inMatrix;
    REALTYPE* offsetBeagleMatrix = gTransitionMatrices[matrixIndex];
    for(int i = 0; i < kCategoryCount; i++) {
        for(int j = 0; j < kStateCount; j++) {
            beagleMemCpy(offsetBeagleMatrix, offsetInMatrix, kStateCount);
            offsetBeagleMatrix[kStateCount] = paddedValue;
            offsetBeagleMatrix += kTransPaddedStateCount; // Skip padding
            offsetInMatrix += kStateCount;
        }
    }
} else {
    beagleMemCpy(gTransitionMatrices[matrixIndex], inMatrix,
                 kMatrixSize * kCategoryCount);
}
    return BEAGLE_SUCCESS;
}